

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_69(fglrx_ioctl_69 *d)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = d->unk00;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk00");
    if (iVar2 != 0) goto LAB_0024b3eb;
  }
  else {
LAB_0024b3eb:
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk04;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk04");
    if (iVar2 != 0) goto LAB_0024b431;
  }
  else {
LAB_0024b431:
    fprintf(_stdout,"%sunk04: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk08;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_0024b470;
  }
  else {
LAB_0024b470:
    fprintf(_stdout,"%sunk08: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk0c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk0c");
    if (iVar2 == 0) goto LAB_0024b4d0;
  }
  fprintf(_stdout,"%sunk0c: 0x%08x",", ",(ulong)uVar1);
LAB_0024b4d0:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_69(struct fglrx_ioctl_69 *d)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	mmt_log_cont_nl();
}